

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall cmComputeTargetDepends::ComputeIntermediateGraph(cmComputeTargetDepends *this)

{
  pointer pcVar1;
  pointer pcVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  TargetType TVar4;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *__x;
  long lVar5;
  long lVar6;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_01;
  allocator<char> local_69;
  cmComputeTargetDepends *local_68;
  cmValue optimizeDependencies;
  string local_50;
  
  lVar6 = 0;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->InitialGraph).
                   super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                   super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x18);
  pcVar1 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = 0;
  local_68 = this;
  do {
    if (((long)pcVar1 - (long)pcVar2) / 0x18 == lVar5) {
      return;
    }
    __x = (vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)
          ((long)&(((local_68->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start)->
                  super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + lVar6);
    this_01 = (vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)
              ((long)&(((local_68->IntermediateGraph).
                        super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        _M_impl.super__Vector_impl_data._M_start)->
                      super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + lVar6);
    this_00 = (local_68->Targets).
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar5];
    TVar4 = cmGeneratorTarget::GetType(this_00);
    if (TVar4 == STATIC_LIBRARY) {
LAB_0047819a:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"OPTIMIZE_DEPENDENCIES",&local_69);
      optimizeDependencies = cmGeneratorTarget::GetProperty(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (optimizeDependencies.Value == (string *)0x0) goto LAB_004781f6;
      bVar3 = cmValue::IsOn(&optimizeDependencies);
      if (!bVar3) goto LAB_004781f6;
      OptimizeLinkDependencies(local_68,this_00,(cmGraphEdgeList *)this_01,(cmGraphEdgeList *)__x);
    }
    else {
      TVar4 = cmGeneratorTarget::GetType(this_00);
      if (TVar4 == OBJECT_LIBRARY) goto LAB_0047819a;
LAB_004781f6:
      std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::operator=(this_01,__x);
    }
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 0x18;
  } while( true );
}

Assistant:

void cmComputeTargetDepends::ComputeIntermediateGraph()
{
  this->IntermediateGraph.resize(0);
  this->IntermediateGraph.resize(this->InitialGraph.size());

  size_t n = this->InitialGraph.size();
  for (size_t i = 0; i < n; ++i) {
    auto const& initialEdges = this->InitialGraph[i];
    auto& intermediateEdges = this->IntermediateGraph[i];
    cmGeneratorTarget const* gt = this->Targets[i];
    if (gt->GetType() != cmStateEnums::STATIC_LIBRARY &&
        gt->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      intermediateEdges = initialEdges;
    } else {
      if (cmValue optimizeDependencies =
            gt->GetProperty("OPTIMIZE_DEPENDENCIES")) {
        if (optimizeDependencies.IsOn()) {
          this->OptimizeLinkDependencies(gt, intermediateEdges, initialEdges);
        } else {
          intermediateEdges = initialEdges;
        }
      } else {
        intermediateEdges = initialEdges;
      }
    }
  }
}